

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_set_number_value_should_set_numbers(void)

{
  UnityAssertEqualNumber(1,1,(char *)0x0,0xe3,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(1.5e-12,1.5,1.5,(char *)0x0,0xe4);
  UnityAssertEqualNumber(-1,-1,(char *)0x0,0xe7,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(-1.5e-12,-1.5,-1.5,(char *)0x0,0xe8);
  UnityAssertEqualNumber(0x7fffffff,0x7fffffff,(char *)0x0,0xeb,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(0.002147483648,2147483648.0,2147483648.0,(char *)0x0,0xec);
  UnityAssertEqualNumber(-0x80000000,-0x80000000,(char *)0x0,0xef,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(-0.002147483649,-2147483649.0,-2147483649.0,(char *)0x0,0xf0);
  return;
}

Assistant:

static void cjson_set_number_value_should_set_numbers(void)
{
    cJSON number[1] = {{NULL, NULL, NULL, cJSON_Number, NULL, 0, 0, NULL}};

    cJSON_SetNumberValue(number, 1.5);
    TEST_ASSERT_EQUAL(1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1.5, number->valuedouble);

    cJSON_SetNumberValue(number, -1.5);
    TEST_ASSERT_EQUAL(-1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1.5, number->valuedouble);

    cJSON_SetNumberValue(number, 1 + (double)INT_MAX);
    TEST_ASSERT_EQUAL(INT_MAX, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1 + (double)INT_MAX, number->valuedouble);

    cJSON_SetNumberValue(number, -1 + (double)INT_MIN);
    TEST_ASSERT_EQUAL(INT_MIN, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1 + (double)INT_MIN, number->valuedouble);
}